

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O2

void __thiscall polyscope::TransformationGizmo::draw(TransformationGizmo *this)

{
  mat4 *pmVar1;
  element_type *peVar2;
  uint *puVar3;
  vec<3,_float,_(glm::qualifier)0> *v;
  glm *this_00;
  bool bVar4;
  vec4 vVar5;
  mat4 P;
  mat4 projMat;
  mat4 viewMat;
  mat4 Pinv;
  allocator local_385;
  float local_384;
  uint local_380;
  uint local_37c;
  undefined8 local_378;
  float local_36c;
  undefined8 local_368;
  float local_360;
  undefined4 local_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  mat<4,_4,_float,_(glm::qualifier)0> local_128;
  mat<4,_4,_float,_(glm::qualifier)0> local_e8;
  mat<4,_4,_float,_(glm::qualifier)0> local_a8;
  mat<4,_4,_float,_(glm::qualifier)0> local_68;
  
  if ((this->enabled).value == true) {
    if ((this->ringProgram).
        super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      prepare(this);
    }
    pmVar1 = this->T;
    local_a8.value[0].field_0 = pmVar1->value[0].field_0;
    local_a8.value[0].field_1 = pmVar1->value[0].field_1;
    local_a8.value[0].field_2 = pmVar1->value[0].field_2;
    local_36c = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call
                          ((vec<3,_float,_(glm::qualifier)0> *)&local_a8);
    local_384 = (float)((double)this->gizmoSizeRel * state::lengthScale);
    view::getCameraViewMatrix();
    glm::operator*(&local_e8,&local_128,this->T);
    this_00 = (glm *)&local_368;
    local_368 = CONCAT44(local_384,local_384);
    local_360 = local_384;
    glm::scale<float,(glm::qualifier)0>(&local_68,this_00,v);
    glm::operator*(&local_a8,&local_e8,&local_68);
    peVar2 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_148,"u_modelView",(allocator *)&local_e8);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_148,&local_a8);
    std::__cxx11::string::~string(local_148);
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_168,"u_modelView",(allocator *)&local_e8);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_168,&local_a8);
    std::__cxx11::string::~string(local_168);
    peVar2 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_188,"u_modelView",(allocator *)&local_e8);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_188,&local_a8);
    std::__cxx11::string::~string(local_188);
    view::getCameraPerspectiveMatrix();
    peVar2 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_1a8,"u_projMatrix",(allocator *)&local_128);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_1a8,&local_e8);
    std::__cxx11::string::~string(local_1a8);
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_1c8,"u_projMatrix",(allocator *)&local_128);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_1c8,&local_e8);
    std::__cxx11::string::~string(local_1c8);
    peVar2 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_1e8,"u_projMatrix",(allocator *)&local_128);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_1e8,&local_e8);
    std::__cxx11::string::~string(local_1e8);
    peVar2 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_208,"u_diskWidthRel",(allocator *)&local_128);
    (*peVar2->_vptr_ShaderProgram[5])((ulong)(uint)this->diskWidthObj,peVar2,local_208);
    std::__cxx11::string::~string(local_208);
    local_368 = 0;
    local_37c = 0;
    local_378 = 0;
    local_380 = 0;
    if (this->selectedType == Rotation) {
      if (this->selectedDim == 2) {
        this_00 = (glm *)&local_37c;
      }
      else if (this->selectedDim == 1) {
        this_00 = (glm *)((long)&local_368 + 4);
      }
      *(undefined4 *)this_00 = 0x3f800000;
    }
    peVar2 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_228,"u_active",(allocator *)&local_128);
    (*peVar2->_vptr_ShaderProgram[9])(local_368,(ulong)local_37c,peVar2,local_228);
    std::__cxx11::string::~string(local_228);
    if (this->selectedType == Translation) {
      if (this->selectedDim == 2) {
        puVar3 = &local_380;
      }
      else if (this->selectedDim == 1) {
        puVar3 = (uint *)((long)&local_378 + 4);
      }
      else {
        puVar3 = (uint *)&local_378;
      }
      *puVar3 = 0x3f800000;
    }
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_248,"u_active",(allocator *)&local_128);
    (*peVar2->_vptr_ShaderProgram[9])(local_378,(ulong)local_380,peVar2,local_248);
    std::__cxx11::string::~string(local_248);
    bVar4 = this->selectedType == Scale;
    if (bVar4) {
      uStack_34c = 0x3f733333;
      local_358 = 0x3f733333;
      uStack_354 = 0x3f733333;
      uStack_350 = 0x3f733333;
    }
    else {
      uStack_34c = 0x3f59999a;
      local_358 = 0x3f59999a;
      uStack_354 = 0x3f59999a;
      uStack_350 = 0x3f59999a;
    }
    view::getCameraPerspectiveMatrix();
    glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_68,&local_128);
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_268,"u_invProjMatrix",&local_385);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_268,&local_68);
    std::__cxx11::string::~string(local_268);
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_288,"u_viewport",&local_385);
    vVar5 = render::Engine::getCurrentViewport(render::engine);
    (*peVar2->_vptr_ShaderProgram[10])(vVar5._0_8_,vVar5._8_8_,peVar2,local_288);
    std::__cxx11::string::~string(local_288);
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_2a8,"u_lengthMult",&local_385);
    (*peVar2->_vptr_ShaderProgram[5])((ulong)(uint)this->vecLength,peVar2,local_2a8);
    std::__cxx11::string::~string(local_2a8);
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_2c8,"u_radius",&local_385);
    local_384 = local_384 * local_36c;
    (*peVar2->_vptr_ShaderProgram[6])((double)local_384 * 0.2,peVar2,local_2c8);
    std::__cxx11::string::~string(local_2c8);
    peVar2 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_2e8,"u_invProjMatrix",&local_385);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_2e8,&local_68);
    std::__cxx11::string::~string(local_2e8);
    peVar2 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_308,"u_viewport",&local_385);
    vVar5 = render::Engine::getCurrentViewport(render::engine);
    (*peVar2->_vptr_ShaderProgram[10])(vVar5._0_8_,vVar5._8_8_,peVar2,local_308);
    std::__cxx11::string::~string(local_308);
    peVar2 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_328,"u_pointRadius",&local_385);
    (*peVar2->_vptr_ShaderProgram[5])((ulong)(uint)(local_384 * this->sphereRad),peVar2,local_328);
    std::__cxx11::string::~string(local_328);
    peVar2 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_348,"u_baseColor",&local_385);
    (*peVar2->_vptr_ShaderProgram[9])
              (CONCAT44(uStack_354,local_358),
               (ulong)((uint)bVar4 * 0x3f733333 + (uint)!bVar4 * 0x3f59999a),peVar2,local_348);
    std::__cxx11::string::~string(local_348);
    (*render::engine->_vptr_Engine[10])(render::engine,0);
    (*render::engine->_vptr_Engine[0xb])(render::engine,0);
    (*render::engine->_vptr_Engine[0xd])(render::engine,0);
    (*((this->ringProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
    (*((this->arrowProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
    (*((this->sphereProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
  }
  return;
}

Assistant:

void TransformationGizmo::draw() {
  if (!enabled.get()) return;
  if (!ringProgram) prepare();

  // == set uniforms

  float transScale = glm::length(glm::vec3(T[0]));
  float gizmoSizePreTrans = gizmoSizeRel * state::lengthScale;
  float gizmoSize = transScale * gizmoSizePreTrans;

  glm::mat4 viewMat =
      view::getCameraViewMatrix() * T * glm::scale(glm::vec3{gizmoSizePreTrans, gizmoSizePreTrans, gizmoSizePreTrans});
  ringProgram->setUniform("u_modelView", glm::value_ptr(viewMat));
  arrowProgram->setUniform("u_modelView", glm::value_ptr(viewMat));
  sphereProgram->setUniform("u_modelView", glm::value_ptr(viewMat));

  glm::mat4 projMat = view::getCameraPerspectiveMatrix();
  ringProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
  arrowProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
  sphereProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));

  ringProgram->setUniform("u_diskWidthRel", diskWidthObj);

  // set selections
  glm::vec3 selectRot{0., 0., 0.};
  glm::vec3 selectTrans{0., 0., 0.};
  glm::vec3 sphereColor(0.85);
  if (selectedType == TransformHandle::Rotation) {
    selectRot[selectedDim] = 1.;
  }
  ringProgram->setUniform("u_active", selectRot);
  if (selectedType == TransformHandle::Translation) {
    selectTrans[selectedDim] = 1.;
  }
  arrowProgram->setUniform("u_active", selectTrans);
  if (selectedType == TransformHandle::Scale) {
    sphereColor = glm::vec3(0.95);
  }

  glm::mat4 P = view::getCameraPerspectiveMatrix();
  glm::mat4 Pinv = glm::inverse(P);
  arrowProgram->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  arrowProgram->setUniform("u_viewport", render::engine->getCurrentViewport());
  arrowProgram->setUniform("u_lengthMult", vecLength);
  arrowProgram->setUniform("u_radius", 0.2 * gizmoSize);

  sphereProgram->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  sphereProgram->setUniform("u_viewport", render::engine->getCurrentViewport());

  sphereProgram->setUniform("u_pointRadius", sphereRad * gizmoSize);
  sphereProgram->setUniform("u_baseColor", sphereColor);

  render::engine->setDepthMode(DepthMode::Less);
  render::engine->setBlendMode();
  render::engine->setBackfaceCull(false);

  // == draw

  ringProgram->draw();
  arrowProgram->draw();
  sphereProgram->draw();
}